

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O1

AbstractStreamReader *
METADemuxer::createCodec
          (string *codecName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *addParams,string *codecStreamName,
          vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *mplsInfo)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  TextSubtitlesRender *pTVar5;
  double dVar6;
  vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *mplsInfo_00;
  uint8_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  int iVar10;
  uint32_t uVar11;
  PipCorner PVar12;
  uint uVar13;
  uint uVar14;
  int32_t iVar15;
  VideoAspectRatio VVar16;
  LPCMStreamReader *this;
  _Base_ptr p_Var17;
  undefined6 extraout_var;
  const_iterator cVar18;
  long lVar19;
  SimplePacketizerReader *this_00;
  pointer puVar20;
  undefined *puVar21;
  undefined4 *puVar22;
  LPCMStreamReader *pLVar23;
  float fVar24;
  undefined4 uVar25;
  double fps;
  undefined4 uVar26;
  ostringstream ss;
  Font font;
  TextAnimation animation;
  double local_280;
  string local_270 [11];
  undefined8 local_f8;
  char *local_f0;
  undefined8 local_e8;
  char local_e0;
  undefined7 uStack_df;
  ulong local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  TextAnimation local_b8 [2];
  long local_a8 [2];
  uint *local_98;
  undefined8 local_90;
  uint local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint *local_78;
  undefined8 local_70;
  uint local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  uint *local_58;
  undefined8 local_50;
  uint local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *local_38;
  
  local_38 = mplsInfo;
  iVar10 = std::__cxx11::string::compare((char *)codecName);
  if ((iVar10 == 0) || (iVar10 = std::__cxx11::string::compare((char *)codecName), iVar10 == 0)) {
    this = (LPCMStreamReader *)operator_new(0x250);
    H264StreamReader::H264StreamReader((H264StreamReader *)this);
    iVar10 = std::__cxx11::string::compare((char *)codecName);
    if (iVar10 == 0) {
      this->m_tmpFrameBuffer[0x113] = '\x01';
    }
    paVar4 = &local_270[0].field_2;
    local_270[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"fps","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
      dVar6 = strToDouble(*(char **)(cVar18._M_node + 2));
      dVar6 = correctFps(dVar6);
      lVar19 = 0;
      if (0.0 < dVar6) {
        lVar19 = (long)(5292000000.0 / dVar6);
      }
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_fps = dVar6;
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerFrame = lVar19;
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerField = lVar19 / 2;
    }
    local_270[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"delPulldown","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_removePulldown = true;
    }
    local_270[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"level","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
      pLVar23 = (LPCMStreamReader *)0x0;
      if ((((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
          super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader ==
          (_func_int **)&PTR__H264StreamReader_00240778) {
        pLVar23 = this;
      }
      dVar6 = strToDouble(*(char **)(cVar18._M_node + 2));
      pLVar23->m_tmpFrameBuffer[0x21] = (char)(int)dVar6 * '\n';
    }
    local_270[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"insertSEI","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
      this->m_tmpFrameBuffer[0x45] = '\x01';
      this->m_tmpFrameBuffer[0x46] = '\0';
      this->m_tmpFrameBuffer[0x47] = '\0';
      this->m_tmpFrameBuffer[0x48] = '\0';
    }
    local_270[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"autoSEI","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
      this->m_tmpFrameBuffer[0x45] = '\x01';
      this->m_tmpFrameBuffer[0x46] = '\0';
      this->m_tmpFrameBuffer[0x47] = '\0';
      this->m_tmpFrameBuffer[0x48] = '\0';
    }
    local_270[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"forceSEI","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
      this->m_tmpFrameBuffer[0x45] = '\x02';
      this->m_tmpFrameBuffer[0x46] = '\0';
      this->m_tmpFrameBuffer[0x47] = '\0';
      this->m_tmpFrameBuffer[0x48] = '\0';
    }
    local_270[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"contSPS","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
      this->m_tmpFrameBuffer[0x11] = '\x01';
    }
    goto LAB_001a8cb0;
  }
  iVar10 = std::__cxx11::string::compare((char *)codecName);
  if (iVar10 == 0) {
    this = (LPCMStreamReader *)operator_new(0x198);
    HEVCStreamReader::HEVCStreamReader((HEVCStreamReader *)this);
    local_270[0]._M_dataplus._M_p = (pointer)&local_270[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"fps","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
  }
  else {
    iVar10 = std::__cxx11::string::compare((char *)codecName);
    if (iVar10 != 0) {
      iVar10 = std::__cxx11::string::compare((char *)codecName);
      if (iVar10 == 0) {
        this = (LPCMStreamReader *)operator_new(0x1f8);
        VC1StreamReader::VC1StreamReader((VC1StreamReader *)this);
        paVar4 = &local_270[0].field_2;
        local_270[0]._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"fps","");
        cVar18 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&addParams->_M_t,local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270[0]._M_dataplus._M_p != paVar4) {
          operator_delete(local_270[0]._M_dataplus._M_p,
                          local_270[0].field_2._M_allocated_capacity + 1);
        }
        p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
          dVar6 = strToDouble(*(char **)(cVar18._M_node + 2));
          dVar6 = correctFps(dVar6);
          lVar19 = 0;
          if (0.0 < dVar6) {
            lVar19 = (long)(5292000000.0 / dVar6);
          }
          ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_fps = dVar6;
          ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerFrame = lVar19;
          ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerField = lVar19 / 2;
        }
        local_270[0]._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"delPulldown","");
        cVar18 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&addParams->_M_t,local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270[0]._M_dataplus._M_p != paVar4) {
          operator_delete(local_270[0]._M_dataplus._M_p,
                          local_270[0].field_2._M_allocated_capacity + 1);
        }
        if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
          ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_removePulldown = true;
        }
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)codecName);
        if (iVar10 == 0) {
          this = (LPCMStreamReader *)operator_new(600);
          MPEG2StreamReader::MPEG2StreamReader((MPEG2StreamReader *)this);
          paVar4 = &local_270[0].field_2;
          local_270[0]._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"fps","");
          cVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&addParams->_M_t,local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270[0]._M_dataplus._M_p != paVar4) {
            operator_delete(local_270[0]._M_dataplus._M_p,
                            local_270[0].field_2._M_allocated_capacity + 1);
          }
          p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
            dVar6 = strToDouble(*(char **)(cVar18._M_node + 2));
            dVar6 = correctFps(dVar6);
            lVar19 = 0;
            if (0.0 < dVar6) {
              lVar19 = (long)(5292000000.0 / dVar6);
            }
            ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_fps = dVar6;
            ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerFrame = lVar19;
            ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerField = lVar19 / 2
            ;
          }
          local_270[0]._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"ar","");
          cVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&addParams->_M_t,local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270[0]._M_dataplus._M_p != paVar4) {
            operator_delete(local_270[0]._M_dataplus._M_p,
                            local_270[0].field_2._M_allocated_capacity + 1);
          }
          if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
            lVar19 = __dynamic_cast(this,&AbstractStreamReader::typeinfo,&MPEGStreamReader::typeinfo
                                    ,0);
            VVar16 = arNameToCode((string *)(cVar18._M_node + 2));
            *(VideoAspectRatio *)(lVar19 + 0x58) = VVar16;
          }
          local_270[0]._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"delPulldown","");
          cVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&addParams->_M_t,local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270[0]._M_dataplus._M_p != paVar4) {
            operator_delete(local_270[0]._M_dataplus._M_p,
                            local_270[0].field_2._M_allocated_capacity + 1);
          }
          if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
            ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_removePulldown = true;
          }
        }
        else {
          iVar10 = std::__cxx11::string::compare((char *)codecName);
          if (iVar10 == 0) {
            this = (LPCMStreamReader *)operator_new(0xf8);
            memset(this,0,0xf8);
            SimplePacketizerReader::SimplePacketizerReader((SimplePacketizerReader *)this);
            ((iterator *)&this->m_headerType)->_M_cur = (_Elt_pointer)0x0;
            this->m_tmpFrameBuffer[1] = 0;
            this->m_tmpFrameBuffer[5] = 0x80;
            this->m_tmpFrameBuffer[6] = 0xbb;
            this->m_tmpFrameBuffer[7] = '\0';
            this->m_tmpFrameBuffer[8] = '\0';
            *(_Elt_pointer *)(this->m_tmpFrameBuffer + 9) = (_Elt_pointer)0x0;
            *(undefined4 *)(this->m_tmpFrameBuffer + 0x11) = 0;
            puVar21 = &AACStreamReader::vtable;
          }
          else {
            iVar10 = std::__cxx11::string::compare((char *)codecName);
            if (iVar10 != 0) {
              iVar10 = std::__cxx11::string::compare((char *)codecName);
              if (iVar10 == 0) {
                this = (LPCMStreamReader *)operator_new(0x100);
                SimplePacketizerReader::SimplePacketizerReader((SimplePacketizerReader *)this);
                (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->
                super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__SimplePacketizerReader_00240648
                ;
                *(undefined1 *)&((iterator *)&this->m_headerType)->_M_cur = 1;
                this->m_useNewStyleAudioPES = false;
                this->m_testMode = false;
                this->m_firstFrame = false;
                this->m_tmpFrameBuffer[0] = '\0';
                this->m_tmpFrameBuffer[1] = '\0';
                this->m_tmpFrameBuffer[2] = '\0';
                this->m_tmpFrameBuffer[3] = '\0';
                this->m_tmpFrameBuffer[4] = '\0';
                *(_Elt_pointer *)(this->m_tmpFrameBuffer + 9) = (_Elt_pointer)0x0;
                *(_Map_pointer *)(this->m_tmpFrameBuffer + 0x11) = (_Map_pointer)0x0;
              }
              else {
                iVar10 = std::__cxx11::string::compare((char *)codecName);
                if (iVar10 == 0) {
                  this = (LPCMStreamReader *)operator_new(0x4490);
                  LPCMStreamReader::LPCMStreamReader(this);
                  goto LAB_001a8cb0;
                }
                iVar10 = std::__cxx11::string::compare((char *)codecName);
                if (iVar10 != 0) {
                  iVar10 = std::__cxx11::string::compare((char *)codecName);
                  if (iVar10 == 0) {
                    this = (LPCMStreamReader *)operator_new(0x150);
                    DTSStreamReader::DTSStreamReader((DTSStreamReader *)this);
                    local_270[0]._M_dataplus._M_p = (pointer)&local_270[0].field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_270,"down-to-dts","");
                    cVar18 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::find(&addParams->_M_t,local_270);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_270[0]._M_dataplus._M_p != &local_270[0].field_2) {
                      operator_delete(local_270[0]._M_dataplus._M_p,
                                      local_270[0].field_2._M_allocated_capacity + 1);
                    }
                    if ((_Rb_tree_header *)cVar18._M_node !=
                        &(addParams->_M_t)._M_impl.super__Rb_tree_header) {
                      this->m_tmpFrameBuffer[7] = '\x01';
                    }
                  }
                  else {
                    iVar10 = std::__cxx11::string::compare((char *)codecName);
                    if (iVar10 == 0) {
                      this = (LPCMStreamReader *)operator_new(0x1c8);
                      AC3StreamReader::AC3StreamReader((AC3StreamReader *)this);
                      local_270[0]._M_dataplus._M_p = (pointer)&local_270[0].field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_270,"down-to-ac3","");
                      cVar18 = std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::find(&addParams->_M_t,local_270);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_270[0]._M_dataplus._M_p != &local_270[0].field_2) {
                        operator_delete(local_270[0]._M_dataplus._M_p,
                                        local_270[0].field_2._M_allocated_capacity + 1);
                      }
                      if ((_Rb_tree_header *)cVar18._M_node !=
                          &(addParams->_M_t)._M_impl.super__Rb_tree_header) {
                        this->m_tmpFrameBuffer[6] = '\x01';
                      }
                    }
                    else {
                      iVar10 = std::__cxx11::string::compare((char *)codecName);
                      if (iVar10 == 0) {
                        this = (LPCMStreamReader *)operator_new(0x1e8);
                        PGSStreamReader::PGSStreamReader((PGSStreamReader *)this);
                        paVar4 = &local_270[0].field_2;
                        local_270[0]._M_dataplus._M_p = (pointer)paVar4;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_270,"bottom-offset","");
                        cVar18 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::find(&addParams->_M_t,local_270);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_270[0]._M_dataplus._M_p != paVar4) {
                          operator_delete(local_270[0]._M_dataplus._M_p,
                                          local_270[0].field_2._M_allocated_capacity + 1);
                        }
                        p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
                        if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
                          pLVar23 = (LPCMStreamReader *)0x0;
                          if ((((MPEGStreamReader *)&this->super_SimplePacketizerReader)->
                              super_AbstractStreamReader).super_BaseAbstractStreamReader.
                              _vptr_BaseAbstractStreamReader ==
                              (_func_int **)&PTR__PGSStreamReader_002421d8) {
                            pLVar23 = this;
                          }
                          iVar15 = strToInt32(*(char **)(cVar18._M_node + 2));
                          *(int32_t *)(*(long *)(pLVar23->m_tmpFrameBuffer + 0x69) + 0xc) = iVar15;
                        }
                        local_270[0]._M_dataplus._M_p = (pointer)paVar4;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_270,"3d-plane","");
                        cVar18 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::find(&addParams->_M_t,local_270);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_270[0]._M_dataplus._M_p != paVar4) {
                          operator_delete(local_270[0]._M_dataplus._M_p,
                                          local_270[0].field_2._M_allocated_capacity + 1);
                        }
                        if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
                          pLVar23 = (LPCMStreamReader *)0x0;
                          if ((((MPEGStreamReader *)&this->super_SimplePacketizerReader)->
                              super_AbstractStreamReader).super_BaseAbstractStreamReader.
                              _vptr_BaseAbstractStreamReader ==
                              (_func_int **)&PTR__PGSStreamReader_002421d8) {
                            pLVar23 = this;
                          }
                          uVar7 = strToInt8u(*(char **)(cVar18._M_node + 2));
                          pLVar23->m_tmpFrameBuffer[0xff] = uVar7;
                        }
                        local_270[0]._M_dataplus._M_p = (pointer)paVar4;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_270,"fps","");
                        cVar18 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::find(&addParams->_M_t,local_270);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_270[0]._M_dataplus._M_p != paVar4) {
                          operator_delete(local_270[0]._M_dataplus._M_p,
                                          local_270[0].field_2._M_allocated_capacity + 1);
                        }
                        if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
                          uVar25 = 0;
                          uVar26 = 0;
                        }
                        else {
                          dVar6 = strToDouble(*(char **)(cVar18._M_node + 2));
                          uVar25 = SUB84(dVar6,0);
                          uVar26 = (undefined4)((ulong)dVar6 >> 0x20);
                        }
                        local_270[0]._M_dataplus._M_p = (pointer)paVar4;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_270,"video-width","");
                        cVar18 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::find(&addParams->_M_t,local_270);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_270[0]._M_dataplus._M_p != paVar4) {
                          operator_delete(local_270[0]._M_dataplus._M_p,
                                          local_270[0].field_2._M_allocated_capacity + 1);
                        }
                        if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
                          uVar8 = 0;
                        }
                        else {
                          uVar8 = strToInt16u(*(char **)(cVar18._M_node + 2));
                        }
                        local_270[0]._M_dataplus._M_p = (pointer)paVar4;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_270,"video-height","");
                        cVar18 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::find(&addParams->_M_t,local_270);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_270[0]._M_dataplus._M_p != paVar4) {
                          operator_delete(local_270[0]._M_dataplus._M_p,
                                          local_270[0].field_2._M_allocated_capacity + 1);
                        }
                        if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
                          uVar9 = 0;
                        }
                        else {
                          uVar9 = strToInt16u(*(char **)(cVar18._M_node + 2));
                        }
                        PGSStreamReader::setVideoInfo
                                  ((PGSStreamReader *)this,uVar8,uVar9,
                                   (double)CONCAT44(uVar26,uVar25));
                        local_270[0]._M_dataplus._M_p = (pointer)paVar4;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_270,"font-border","");
                        cVar18 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::find(&addParams->_M_t,local_270);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_270[0]._M_dataplus._M_p != paVar4) {
                          operator_delete(local_270[0]._M_dataplus._M_p,
                                          local_270[0].field_2._M_allocated_capacity + 1);
                        }
                        if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
                          pLVar23 = (LPCMStreamReader *)0x0;
                          if ((((MPEGStreamReader *)&this->super_SimplePacketizerReader)->
                              super_AbstractStreamReader).super_BaseAbstractStreamReader.
                              _vptr_BaseAbstractStreamReader ==
                              (_func_int **)&PTR__PGSStreamReader_002421d8) {
                            pLVar23 = this;
                          }
                          iVar15 = strToInt32(*(char **)(cVar18._M_node + 2));
                          *(int32_t *)
                           ((long)&((MPEGStreamReader *)&pLVar23->super_SimplePacketizerReader)->
                                   m_testPulldownDts + 4) = iVar15;
                        }
                      }
                      else {
                        iVar10 = std::__cxx11::string::compare((char *)codecName);
                        if (iVar10 != 0) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_270,"Unsupported codec ",0x12);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_270,(codecName->_M_dataplus)._M_p,
                                     codecName->_M_string_length);
                          puVar22 = (undefined4 *)__cxa_allocate_exception(0x28);
                          std::__cxx11::stringbuf::str();
                          *puVar22 = 0x1f5;
                          *(undefined4 **)(puVar22 + 2) = puVar22 + 6;
                          if (local_78 == &local_68) {
                            puVar22[6] = local_68;
                            puVar22[7] = uStack_64;
                            puVar22[8] = uStack_60;
                            puVar22[9] = uStack_5c;
                          }
                          else {
                            *(uint **)(puVar22 + 2) = local_78;
                            *(ulong *)(puVar22 + 6) = CONCAT44(uStack_64,local_68);
                          }
                          *(undefined8 *)(puVar22 + 4) = local_70;
                          local_70 = 0;
                          local_68 = local_68 & 0xffffff00;
                          local_78 = &local_68;
                          __cxa_throw(puVar22,&VodCoreException::typeinfo,
                                      VodCoreException::~VodCoreException);
                        }
                        this = (LPCMStreamReader *)operator_new(0x188);
                        SRTStreamReader::SRTStreamReader((SRTStreamReader *)this);
                        local_f0 = &local_e0;
                        local_e8 = 0;
                        local_e0 = '\0';
                        local_d0 = 0x12;
                        uStack_c8 = 0;
                        local_c0 = 0x3f80000000ffffff;
                        local_b8[0].fadeInDuration = 0.0;
                        local_b8[0].fadeOutDuration = 0.0;
                        p_Var17 = (addParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                        p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
                        if ((_Rb_tree_header *)p_Var17 == p_Var1) {
                          local_f8 = 0;
                          local_280 = 0.0;
                          uVar8 = 0;
                        }
                        else {
                          local_280 = 0.0;
                          uVar8 = 0;
                          local_f8 = 0;
                          do {
                            p_Var2 = p_Var17 + 1;
                            iVar10 = std::__cxx11::string::compare((char *)p_Var2);
                            if (iVar10 == 0) {
                              unquoteStr(local_270,(string *)(p_Var17 + 2));
                              std::__cxx11::string::operator=
                                        ((string *)&local_f0,(string *)local_270);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_270[0]._M_dataplus._M_p != &local_270[0].field_2) {
                                operator_delete(local_270[0]._M_dataplus._M_p,
                                                local_270[0].field_2._M_allocated_capacity + 1);
                              }
                            }
                            else {
                              iVar10 = std::__cxx11::string::compare((char *)p_Var2);
                              if (iVar10 == 0) {
                                iVar15 = strToInt32(*(char **)(p_Var17 + 2));
                                local_d0 = CONCAT44(local_d0._4_4_,iVar15);
                              }
                              else {
                                iVar10 = std::__cxx11::string::compare((char *)p_Var2);
                                if (iVar10 == 0) {
                                  local_d0 = local_d0 | 0x100000000;
                                }
                                else {
                                  iVar10 = std::__cxx11::string::compare((char *)p_Var2);
                                  if (iVar10 == 0) {
                                    local_d0 = local_d0 | 0x200000000;
                                  }
                                  else {
                                    iVar10 = std::__cxx11::string::compare((char *)p_Var2);
                                    if (iVar10 == 0) {
                                      local_d0 = local_d0 | 0x400000000;
                                    }
                                    else {
                                      iVar10 = std::__cxx11::string::compare((char *)p_Var2);
                                      if (iVar10 == 0) {
                                        local_d0 = local_d0 | 0x800000000;
                                      }
                                      else {
                                        iVar10 = std::__cxx11::string::compare((char *)p_Var2);
                                        if (iVar10 == 0) {
                                          p_Var2 = p_Var17 + 2;
                                          if (((p_Var17[2]._M_parent < (_Base_ptr)0x2) ||
                                              (**(char **)p_Var2 != '0')) ||
                                             ((*(char **)p_Var2)[1] != 'x')) {
                                            if ((p_Var17[2]._M_parent == (_Base_ptr)0x0) ||
                                               (**(char **)p_Var2 != 'x')) {
                                              uVar11 = strToInt32u(*(char **)p_Var2,10);
                                              local_c0 = CONCAT44(local_c0._4_4_,uVar11);
                                            }
                                            else {
                                              std::__cxx11::string::substr
                                                        ((ulong)local_270,(ulong)p_Var2);
                                              uVar11 = strToInt32u(local_270[0]._M_dataplus._M_p,
                                                                   0x10);
                                              local_c0 = CONCAT44(local_c0._4_4_,uVar11);
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_270[0]._M_dataplus._M_p !=
                                                  &local_270[0].field_2) {
                                                operator_delete(local_270[0]._M_dataplus._M_p,
                                                                local_270[0].field_2.
                                                                _M_allocated_capacity + 1);
                                              }
                                            }
                                          }
                                          else {
                                            std::__cxx11::string::substr
                                                      ((ulong)local_270,(ulong)p_Var2);
                                            uVar11 = strToInt32u(local_270[0]._M_dataplus._M_p,0x10)
                                            ;
                                            local_c0 = CONCAT44(local_c0._4_4_,uVar11);
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_270[0]._M_dataplus._M_p !=
                                                &local_270[0].field_2) {
                                              operator_delete(local_270[0]._M_dataplus._M_p,
                                                              local_270[0].field_2.
                                                              _M_allocated_capacity + 1);
                                            }
                                          }
                                          if ((uint)local_c0 < 0x1000000) {
                                            local_c0 = local_c0 | 0xff000000;
                                          }
                                        }
                                        else {
                                          iVar10 = std::__cxx11::string::compare((char *)p_Var2);
                                          if (iVar10 == 0) {
                                            fVar24 = strToFloat(*(char **)(p_Var17 + 2));
                                            local_c0 = CONCAT44(fVar24,(uint)local_c0);
                                          }
                                          else {
                                            iVar10 = std::__cxx11::string::compare((char *)p_Var2);
                                            if (iVar10 == 0) {
                                              iVar15 = strToInt32(*(char **)(p_Var17 + 2));
                                              uStack_c8 = CONCAT44(iVar15,(undefined4)uStack_c8);
                                            }
                                            else {
                                              iVar10 = std::__cxx11::string::compare((char *)p_Var2)
                                              ;
                                              if (iVar10 == 0) {
                                                fVar24 = strToFloat(*(char **)(p_Var17 + 2));
                                                uStack_c8 = CONCAT44(uStack_c8._4_4_,fVar24);
                                              }
                                              else {
                                                iVar10 = std::__cxx11::string::compare
                                                                   ((char *)p_Var2);
                                                if (iVar10 == 0) {
                                                  local_280 = strToDouble(*(char **)(p_Var17 + 2));
                                                }
                                                else {
                                                  iVar10 = std::__cxx11::string::compare
                                                                     ((char *)p_Var2);
                                                  if (iVar10 == 0) {
                                                    uVar8 = strToInt16u(*(char **)(p_Var17 + 2));
                                                  }
                                                  else {
                                                    iVar10 = std::__cxx11::string::compare
                                                                       ((char *)p_Var2);
                                                    if (iVar10 == 0) {
                                                      uVar9 = strToInt16u(*(char **)(p_Var17 + 2));
                                                      local_f8 = CONCAT62(extraout_var,uVar9);
                                                    }
                                                    else {
                                                      iVar10 = std::__cxx11::string::compare
                                                                         ((char *)p_Var2);
                                                      if (iVar10 == 0) {
                                                        iVar15 = strToInt32(*(char **)(p_Var17 + 2))
                                                        ;
                                                        (*(TextToPGSConverter **)
                                                          &((MPEGStreamReader *)
                                                           &this->super_SimplePacketizerReader)->
                                                           m_eof)->m_bottomOffset = iVar15;
                                                      }
                                                      else {
                                                        iVar10 = std::__cxx11::string::compare
                                                                           ((char *)p_Var2);
                                                        if (iVar10 == 0) {
                                                          fVar24 = strToFloat(*(char **)(p_Var17 + 2
                                                                                        ));
                                                          local_b8[0].fadeInDuration = fVar24;
                                                        }
                                                        else {
                                                          iVar10 = std::__cxx11::string::compare
                                                                             ((char *)p_Var2);
                                                          if (iVar10 == 0) {
                                                            fVar24 = strToFloat(*(char **)(p_Var17 +
                                                                                          2));
                                                            local_b8[0].fadeOutDuration = fVar24;
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
                          } while ((_Rb_tree_header *)p_Var17 != p_Var1);
                        }
                        if (((uVar8 == 0) || ((uint16_t)local_f8 == 0)) ||
                           ((local_280 == 0.0 && (!NAN(local_280))))) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_270,
                                     "video-width, video-height and fps parameters MUST be provided for SRT tracks"
                                     ,0x4c);
                          puVar22 = (undefined4 *)__cxa_allocate_exception(0x28);
                          std::__cxx11::stringbuf::str();
                          *puVar22 = 3;
                          *(undefined4 **)(puVar22 + 2) = puVar22 + 6;
                          if (local_58 == &local_48) {
                            puVar22[6] = local_48;
                            puVar22[7] = uStack_44;
                            puVar22[8] = uStack_40;
                            puVar22[9] = uStack_3c;
                          }
                          else {
                            *(uint **)(puVar22 + 2) = local_58;
                            *(ulong *)(puVar22 + 6) = CONCAT44(uStack_44,local_48);
                          }
                          *(undefined8 *)(puVar22 + 4) = local_50;
                          local_50 = 0;
                          local_48 = local_48 & 0xffffff00;
                          local_58 = &local_48;
                          __cxa_throw(puVar22,&VodCoreException::typeinfo,
                                      VodCoreException::~VodCoreException);
                        }
                        SRTStreamReader::setVideoInfo
                                  ((SRTStreamReader *)this,uVar8,(uint16_t)local_f8,local_280);
                        pTVar5 = (*(TextToPGSConverter **)
                                   &((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_eof
                                 )->m_textRender;
                        (*pTVar5->_vptr_TextSubtitlesRender[2])(pTVar5,&local_f0);
                        SRTStreamReader::setAnimation((SRTStreamReader *)this,local_b8);
                        if (local_f0 != &local_e0) {
                          operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
                        }
                      }
                    }
                  }
                  goto LAB_001a8cb0;
                }
                this = (LPCMStreamReader *)operator_new(0x100);
                SimplePacketizerReader::SimplePacketizerReader((SimplePacketizerReader *)this);
                *(undefined1 *)&((iterator *)&this->m_headerType)->_M_cur = 0;
                this->m_tmpFrameBuffer[0xd] = '\0';
                this->m_tmpFrameBuffer[0xe] = '\0';
                this->m_tmpFrameBuffer[0xf] = '\0';
                this->m_tmpFrameBuffer[0x10] = '\0';
                this->m_tmpFrameBuffer[0x11] = '\0';
                this->m_tmpFrameBuffer[0x12] = '\0';
                this->m_tmpFrameBuffer[0x13] = '\0';
                this->m_tmpFrameBuffer[0x14] = '\0';
                this->m_useNewStyleAudioPES = false;
                this->m_testMode = false;
                this->m_firstFrame = false;
                this->m_tmpFrameBuffer[0] = '\0';
                this->m_tmpFrameBuffer[1] = '\0';
                this->m_tmpFrameBuffer[2] = '\0';
                this->m_tmpFrameBuffer[3] = '\0';
                this->m_tmpFrameBuffer[4] = '\0';
                this->m_tmpFrameBuffer[2] = '\0';
                this->m_tmpFrameBuffer[3] = '\0';
                this->m_tmpFrameBuffer[4] = '\0';
                this->m_tmpFrameBuffer[5] = '\0';
                this->m_tmpFrameBuffer[6] = '\0';
                this->m_tmpFrameBuffer[7] = '\0';
                this->m_tmpFrameBuffer[8] = '\0';
                this->m_tmpFrameBuffer[9] = '\0';
                (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->
                super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__SimplePacketizerReader_00241350
                ;
              }
              this->m_tmpFrameBuffer[0x19] = '\0';
              this->m_tmpFrameBuffer[0x1a] = '\0';
              this->m_tmpFrameBuffer[0x1b] = '\0';
              this->m_tmpFrameBuffer[0x1c] = '\0';
              this->m_tmpFrameBuffer[0x1d] = '\0';
              this->m_tmpFrameBuffer[0x1e] = '\0';
              this->m_tmpFrameBuffer[0x1f] = '\0';
              this->m_tmpFrameBuffer[0x20] = '\0';
              goto LAB_001a8cb0;
            }
            this = (LPCMStreamReader *)operator_new(0xf8);
            memset(this,0,0xf8);
            SimplePacketizerReader::SimplePacketizerReader((SimplePacketizerReader *)this);
            this->m_tmpFrameBuffer[0xd] = '\0';
            this->m_tmpFrameBuffer[0xe] = '\0';
            this->m_tmpFrameBuffer[0xf] = '\0';
            this->m_tmpFrameBuffer[0x10] = '\0';
            this->m_tmpFrameBuffer[0x11] = '\0';
            this->m_tmpFrameBuffer[0x12] = '\0';
            this->m_tmpFrameBuffer[0x13] = '\0';
            this->m_tmpFrameBuffer[0x14] = '\0';
            ((iterator *)&this->m_headerType)->_M_cur = (_Elt_pointer)0x0;
            *(_Elt_pointer *)(this->m_tmpFrameBuffer + 1) = (_Elt_pointer)0x0;
            this->m_tmpFrameBuffer[9] = 0;
            puVar21 = &MpegAudioStreamReader::vtable;
          }
          (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
          super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader =
               (_func_int **)(puVar21 + 0x10);
        }
      }
      goto LAB_001a8cb0;
    }
    this = (LPCMStreamReader *)operator_new(400);
    VVCStreamReader::VVCStreamReader((VVCStreamReader *)this);
    local_270[0]._M_dataplus._M_p = (pointer)&local_270[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"fps","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != &local_270[0].field_2) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar18._M_node != &(addParams->_M_t)._M_impl.super__Rb_tree_header) {
    dVar6 = strToDouble(*(char **)(cVar18._M_node + 2));
    dVar6 = correctFps(dVar6);
    puVar20 = (pointer)0x0;
    if (0.0 < dVar6) {
      puVar20 = (pointer)(long)(5292000000.0 / dVar6);
    }
    ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_fps = dVar6;
    (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
     &((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerFrame)->
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = puVar20;
    ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerField =
         (int64_t)((long)puVar20 / 2);
  }
LAB_001a8cb0:
  if (*(codecName->_M_dataplus)._M_p == 'A') {
    local_270[0]._M_dataplus._M_p = (pointer)&local_270[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"stretch","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != &local_270[0].field_2) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar18._M_node != &(addParams->_M_t)._M_impl.super__Rb_tree_header) {
      p_Var3 = cVar18._M_node + 2;
      lVar19 = std::__cxx11::string::find((char)p_Var3,0x2f);
      if (lVar19 == -1) {
        local_280 = strToDouble(*(char **)p_Var3);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_f0,(ulong)p_Var3);
        std::__cxx11::string::substr((ulong)local_b8,(ulong)p_Var3);
        local_280 = strToDouble(local_f0);
        dVar6 = strToDouble((char *)local_b8[0]);
        if ((dVar6 == 0.0) && (!NAN(dVar6))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_270,"Second argument at stretch parameter can not be 0",0x31);
          puVar22 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar22 = 3;
          *(undefined4 **)(puVar22 + 2) = puVar22 + 6;
          if (local_98 == &local_88) {
            puVar22[6] = local_88;
            puVar22[7] = uStack_84;
            puVar22[8] = uStack_80;
            puVar22[9] = uStack_7c;
          }
          else {
            *(uint **)(puVar22 + 2) = local_98;
            *(ulong *)(puVar22 + 6) = CONCAT44(uStack_84,local_88);
          }
          *(undefined8 *)(puVar22 + 4) = local_90;
          local_90 = 0;
          local_88 = local_88 & 0xffffff00;
          local_98 = &local_88;
          __cxa_throw(puVar22,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        if (local_b8[0] != (TextAnimation)local_a8) {
          operator_delete((void *)local_b8[0],local_a8[0] + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
        }
        local_280 = local_280 / dVar6;
      }
      lVar19 = __dynamic_cast(this,&AbstractStreamReader::typeinfo,&SimplePacketizerReader::typeinfo
                              ,0);
      *(double *)(lVar19 + 0x60) = local_280;
    }
  }
  paVar4 = &local_270[0].field_2;
  local_270[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"secondary","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
    (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
    m_secondary = true;
  }
  local_270[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"pipCorner","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
    PVar12 = TopLeft;
  }
  else {
    PVar12 = pipCornerFromStr((string *)(cVar18._M_node + 2));
  }
  local_270[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"pipHOffset","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
    uVar13 = 0;
  }
  else {
    uVar13 = strToInt32((string *)(cVar18._M_node + 2));
  }
  local_270[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"pipVOffset","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
    uVar14 = 0;
  }
  else {
    uVar14 = strToInt32((string *)(cVar18._M_node + 2));
  }
  local_270[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"pipLumma","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
    iVar15 = 3;
  }
  else {
    iVar15 = strToInt32((string *)(cVar18._M_node + 2));
  }
  local_270[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"pipScale","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
    iVar10 = 1;
  }
  else {
    iVar10 = pipScaleFromStr((string *)(cVar18._M_node + 2));
  }
  mplsInfo_00 = local_38;
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.scaleIndex = iVar10;
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.corner = PVar12;
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.hOffset = uVar13;
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.vOffset = uVar14;
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.lumma = iVar15;
  if (((local_38->super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>)._M_impl.
       super__Vector_impl_data._M_start !=
       (local_38->super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>)._M_impl.
       super__Vector_impl_data._M_finish) &&
     (this_00 = (SimplePacketizerReader *)
                __dynamic_cast(this,&AbstractStreamReader::typeinfo,
                               &SimplePacketizerReader::typeinfo,0),
     this_00 != (SimplePacketizerReader *)0x0)) {
    SimplePacketizerReader::setMPLSInfo(this_00,mplsInfo_00);
  }
  return (AbstractStreamReader *)this;
}

Assistant:

AbstractStreamReader* METADemuxer::createCodec(const string& codecName, const map<string, string>& addParams,
                                               const std::string& codecStreamName, const vector<MPLSPlayItem>& mplsInfo)
{
    AbstractStreamReader* rez = nullptr;
    if (codecName == "V_MPEG4/ISO/AVC" || codecName == "V_MPEG4/ISO/MVC")
    {
        auto h264Reader = new H264StreamReader();
        rez = h264Reader;
        if (codecName == "V_MPEG4/ISO/MVC")
            h264Reader->setIsSubStream(true);

        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<H264StreamReader*>(rez)->setFPS(fps);
        }

        itr = addParams.find("delPulldown");
        if (itr != addParams.end())
            dynamic_cast<H264StreamReader*>(rez)->setRemovePulldown(true);

        itr = addParams.find("level");
        if (itr != addParams.end())
            dynamic_cast<H264StreamReader*>(rez)->setForceLevel(static_cast<uint8_t>(strToDouble(itr->second.c_str())) *
                                                                10);
        itr = addParams.find("insertSEI");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setInsertSEI(H264StreamReader::SeiMethod::SEI_InsertAuto);
        }
        itr = addParams.find("autoSEI");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setInsertSEI(H264StreamReader::SeiMethod::SEI_InsertAuto);
        }
        itr = addParams.find("forceSEI");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setInsertSEI(H264StreamReader::SeiMethod::SEI_InsertForce);
        }
        itr = addParams.find("contSPS");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setH264SPSCont(true);
        }
    }
    else if (codecName == "V_MPEGH/ISO/HEVC")
    {
        rez = new HEVCStreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<HEVCStreamReader*>(rez)->setFPS(fps);
        }
    }
    else if (codecName == "V_MPEGI/ISO/VVC")
    {
        rez = new VVCStreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<VVCStreamReader*>(rez)->setFPS(fps);
        }
    }
    else if (codecName == "V_MS/VFW/WVC1")
    {
        rez = new VC1StreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<VC1StreamReader*>(rez)->setFPS(fps);
        }

        itr = addParams.find("delPulldown");
        if (itr != addParams.end())
            dynamic_cast<VC1StreamReader*>(rez)->setRemovePulldown(true);
    }
    else if (codecName == "V_MPEG-2")
    {
        rez = new MPEG2StreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<MPEG2StreamReader*>(rez)->setFPS(fps);
        }

        itr = addParams.find("ar");
        if (itr != addParams.end())
            dynamic_cast<MPEGStreamReader*>(rez)->setAspectRatio(arNameToCode(itr->second));

        itr = addParams.find("delPulldown");
        if (itr != addParams.end())
            dynamic_cast<MPEG2StreamReader*>(rez)->setRemovePulldown(true);
    }
    else if (codecName == "A_AAC")
        rez = new AACStreamReader();
    else if (codecName == "A_MP3")
        rez = new MpegAudioStreamReader();
    else if (codecName == "S_SUP")
        rez = new DVBSubStreamReader();
    else if (codecName == "A_LPCM")
        rez = new LPCMStreamReader();
    else if (codecName == "A_MLP")
        rez = new MLPStreamReader();
    else if (codecName == "A_DTS")
    {
        rez = new DTSStreamReader();
        auto itr = addParams.find("down-to-dts");
        if (itr != addParams.end())
            dynamic_cast<DTSStreamReader*>(rez)->setDownconvertToDTS(true);
    }
    else if (codecName == "A_AC3")
    {
        rez = new AC3StreamReader();
        auto itr = addParams.find("down-to-ac3");
        if (itr != addParams.end())
            dynamic_cast<AC3StreamReader*>(rez)->setDownconvertToAC3(true);
    }
    else if (codecName == "S_HDMV/PGS")
    {
        rez = new PGSStreamReader();
        auto itr = addParams.find("bottom-offset");
        if (itr != addParams.end())
            dynamic_cast<PGSStreamReader*>(rez)->setBottomOffset(strToInt32(itr->second.c_str()));

        itr = addParams.find("3d-plane");
        if (itr != addParams.end())
            dynamic_cast<PGSStreamReader*>(rez)->setOffsetId(strToInt8u(itr->second.c_str()));

        double fps = 0.0;
        uint16_t width = 0;
        uint16_t height = 0;
        itr = addParams.find("fps");
        if (itr != addParams.end())
            fps = strToDouble(itr->second.c_str());
        itr = addParams.find("video-width");
        if (itr != addParams.end())
            width = strToInt16u(itr->second.c_str());
        itr = addParams.find("video-height");
        if (itr != addParams.end())
            height = strToInt16u(itr->second.c_str());
        dynamic_cast<PGSStreamReader*>(rez)->setVideoInfo(width, height, fps);
        itr = addParams.find("font-border");
        if (itr != addParams.end())
            dynamic_cast<PGSStreamReader*>(rez)->setFontBorder(strToInt32(itr->second.c_str()));
    }
    else if (codecName == "S_TEXT/UTF8")
    {
        auto srtReader = new SRTStreamReader();
        rez = srtReader;
        text_subtitles::Font font;
        uint16_t srtWidth = 0, srtHeight = 0;
        double fps = 0.0;
        text_subtitles::TextAnimation animation;
        for (const auto& addParam : addParams)
        {
            if (addParam.first == "font-name")
            {
                font.m_name = unquoteStr(addParam.second);
            }
            else if (addParam.first == "font-size")
                font.m_size = strToInt32(addParam.second.c_str());
            else if (addParam.first == "font-bold")
                font.m_opts |= text_subtitles::Font::BOLD;
            else if (addParam.first == "font-italic")
                font.m_opts |= text_subtitles::Font::ITALIC;
            else if (addParam.first == "font-underline")
                font.m_opts |= text_subtitles::Font::UNDERLINE;
            else if (addParam.first == "font-strike-out")
                font.m_opts |= text_subtitles::Font::STRIKE_OUT;
            else if (addParam.first == "font-color")
            {
                const string& s = addParam.second;
                if (s.size() >= 2 && s[0] == '0' && s[1] == 'x')
                    font.m_color = strToInt32u(s.substr(2, s.size() - 2).c_str(), 16);
                else if (!s.empty() && s[0] == 'x')
                    font.m_color = strToInt32u(s.substr(1, s.size() - 1).c_str(), 16);
                else
                    font.m_color = strToInt32u(s.c_str());
                if ((font.m_color & 0xff000000u) == 0)
                    font.m_color |= 0xff000000u;
            }
            else if (addParam.first == "line-spacing")
                font.m_lineSpacing = strToFloat(addParam.second.c_str());
            else if (addParam.first == "font-charset")
                font.m_charset = strToInt32(addParam.second.c_str());
            else if (addParam.first == "font-border")
                font.m_borderWidth = strToFloat(addParam.second.c_str());
            else if (addParam.first == "fps")
            {
                fps = strToDouble(addParam.second.c_str());
            }
            else if (addParam.first == "video-width")
                srtWidth = strToInt16u(addParam.second.c_str());
            else if (addParam.first == "video-height")
                srtHeight = strToInt16u(addParam.second.c_str());
            else if (addParam.first == "bottom-offset")
                srtReader->setBottomOffset(strToInt32(addParam.second.c_str()));
            else if (addParam.first == "fadein-time")
                animation.fadeInDuration = strToFloat(addParam.second.c_str());
            else if (addParam.first == "fadeout-time")
                animation.fadeOutDuration = strToFloat(addParam.second.c_str());
        }
        if (srtWidth == 0 || srtHeight == 0 || fps == 0.0)
            THROW(ERR_COMMON, "video-width, video-height and fps parameters MUST be provided for SRT tracks")
        srtReader->setVideoInfo(srtWidth, srtHeight, fps);
        srtReader->setFont(font);
        srtReader->setAnimation(animation);
    }
    else
        THROW(ERR_UNKNOWN_CODEC, "Unsupported codec " << codecName)

    if (codecName[0] == 'A')
    {
        auto itr = addParams.find("stretch");
        if (itr != addParams.end())
        {
            double stretch;
            size_t divPos = itr->second.find('/');
            if (divPos == std::string::npos)
                stretch = strToDouble(itr->second.c_str());
            else
            {
                string firstStr = itr->second.substr(0, divPos);
                string secondStr = itr->second.substr(divPos + 1, itr->second.size() - divPos - 1);
                double dFirst = strToDouble(firstStr.c_str());
                double dSecond = strToDouble(secondStr.c_str());
                if (dSecond != 0.0)
                    stretch = dFirst / dSecond;
                else
                    THROW(ERR_COMMON, "Second argument at stretch parameter can not be 0")
            }
            if (itr != addParams.end())
                dynamic_cast<SimplePacketizerReader*>(rez)->setStretch(stretch);
        }
    }
    auto itr = addParams.find("secondary");
    if (itr != addParams.end())
        rez->setIsSecondary(true);

    PIPParams pipParams;
    itr = addParams.find("pipCorner");
    if (itr != addParams.end())
        pipParams.corner = pipCornerFromStr(itr->second);
    itr = addParams.find("pipHOffset");
    if (itr != addParams.end())
        pipParams.hOffset = strToInt32(itr->second);
    itr = addParams.find("pipVOffset");
    if (itr != addParams.end())
        pipParams.vOffset = strToInt32(itr->second);
    itr = addParams.find("pipLumma");
    if (itr != addParams.end())
        pipParams.lumma = strToInt32(itr->second);
    itr = addParams.find("pipScale");
    if (itr != addParams.end())
        pipParams.scaleIndex = pipScaleFromStr(itr->second);
    rez->setPipParams(pipParams);

    if (!mplsInfo.empty() && dynamic_cast<SimplePacketizerReader*>(rez))
        dynamic_cast<SimplePacketizerReader*>(rez)->setMPLSInfo(mplsInfo);

    return rez;
}